

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> __thiscall
Parser::parseFactor(Parser *this)

{
  function<std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_()> *in_RSI;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  function<bool_(const_Token_&)> local_50;
  _Bind<std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*(Parser_*))()>
  local_30;
  
  local_30._M_f = (offset_in_Parser_to_subr)parseUnary;
  local_30._8_8_ = 0;
  std::function<std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>()>::
  function<std::_Bind<std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>(Parser::*(Parser*))()>,void>
            ((function<std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>()> *)
             &local_50,&local_30);
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<bool_(const_Token_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kamilsan[P]lazy-interpreted-language/src/Parser.cpp:164:26)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<bool_(const_Token_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kamilsan[P]lazy-interpreted-language/src/Parser.cpp:164:26)>
             ::_M_manager;
  parseExpression(this,in_RSI,&local_50);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  return (__uniq_ptr_data<ExpressionNode,_std::default_delete<ExpressionNode>,_true,_true>)
         (__uniq_ptr_data<ExpressionNode,_std::default_delete<ExpressionNode>,_true,_true>)this;
}

Assistant:

std::unique_ptr<ExpressionNode> Parser::parseFactor()
{
  const auto predicate = [](const Token& token) 
  { 
    return token.type == TokenType::Mul ||
      token.type == TokenType::Div; 
  };
  return parseExpression(std::bind(&Parser::parseUnary, this), predicate);
}